

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O2

void __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::AddVars
          (BasicProblem<mp::BasicProblemParams<int>_> *this,int num_vars,Type type)

{
  SafeInt<int> SVar1;
  SafeInt<int> local_3c;
  value_type local_38;
  
  SafeInt<int>::SafeInt<unsigned_long>
            (&local_3c,
             (long)(this->vars_).
                   super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->vars_).
                   super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  SVar1 = operator+(local_3c,num_vars);
  local_38.lb = 0.0;
  local_38.ub = 0.0;
  std::
  vector<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
  ::resize(&this->vars_,(long)SVar1.value_,&local_38);
  std::vector<bool,_std::allocator<bool>_>::resize
            (&this->is_var_int_,(long)SVar1.value_,type != CONTINUOUS);
  return;
}

Assistant:

void AddVars(int num_vars, var::Type type) {
    MP_ASSERT(num_vars >= 0, "invalid size");
    std::size_t new_size = val(SafeInt<int>(vars_.size()) + num_vars);
    vars_.resize(new_size, Var(0, 0));
    is_var_int_.resize(new_size, type != var::CONTINUOUS);
  }